

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

int __thiscall QMessageBoxPrivate::dialogCode(QMessageBoxPrivate *this)

{
  ButtonRole BVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  
  iVar2 = (this->super_QDialogPrivate).rescode;
  if ((1 < iVar2) && (this->clickedButton != (QAbstractButton *)0x0)) {
    piVar4 = &(this->super_QDialogPrivate).rescode;
    BVar1 = QMessageBox::buttonRole
                      (*(QMessageBox **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8
                       ,this->clickedButton);
    piVar3 = (int *)(&DAT_0066ccd4 + (long)BVar1 * 4);
    if ((99U >> ((byte)BVar1 & 0x1f) & 1) == 0) {
      piVar3 = piVar4;
    }
    if (6 < (uint)BVar1) {
      piVar3 = piVar4;
    }
    iVar2 = *piVar3;
  }
  return iVar2;
}

Assistant:

int QMessageBoxPrivate::dialogCode() const
{
    Q_Q(const QMessageBox);

    if (rescode <= QDialog::Accepted) {
        return rescode;
    } else if (clickedButton) {
        switch (q->buttonRole(clickedButton)) {
        case QMessageBox::AcceptRole:
        case QMessageBox::YesRole:
            return QDialog::Accepted;
        case QMessageBox::RejectRole:
        case QMessageBox::NoRole:
            return QDialog::Rejected;
        default:
            ;
        }
    }

    return QDialogPrivate::dialogCode();
}